

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enc.c
# Opt level: O1

void IntraChromaPreds_C(uint8_t *dst,uint8_t *left,uint8_t *top)

{
  uint8_t *puVar1;
  byte bVar2;
  byte bVar3;
  undefined4 uVar4;
  undefined1 auVar5 [13];
  undefined1 auVar6 [13];
  undefined1 auVar7 [13];
  undefined1 auVar8 [13];
  undefined1 auVar9 [13];
  undefined1 auVar10 [13];
  undefined1 auVar11 [13];
  undefined1 auVar12 [13];
  undefined1 auVar13 [13];
  undefined1 auVar14 [13];
  undefined1 auVar15 [13];
  undefined1 auVar16 [13];
  undefined1 auVar17 [13];
  undefined1 auVar18 [13];
  undefined1 auVar19 [13];
  undefined1 auVar20 [13];
  undefined1 auVar21 [13];
  undefined1 auVar22 [13];
  ulong uVar23;
  undefined1 auVar24 [13];
  undefined1 auVar25 [13];
  undefined1 auVar26 [13];
  undefined1 auVar27 [13];
  undefined1 auVar28 [13];
  undefined1 auVar29 [13];
  uint uVar30;
  long lVar31;
  int j_3;
  long lVar32;
  long *plVar33;
  uint8_t *puVar34;
  int j;
  int j_2;
  int iVar35;
  int iVar36;
  int iVar37;
  int iVar38;
  
  if (top == (uint8_t *)0x0) {
    if (left == (uint8_t *)0x0) {
      uVar30 = 0x80;
    }
    else {
      lVar31 = 0;
      iVar35 = 0;
      iVar36 = 0;
      iVar37 = 0;
      iVar38 = 0;
      do {
        uVar4 = *(undefined4 *)(left + lVar31);
        uVar23 = (ulong)(ushort)uVar4 & 0xffffffffffff00ff;
        auVar11._8_4_ = 0;
        auVar11._0_8_ = uVar23;
        auVar11[0xc] = (char)((uint)uVar4 >> 0x18);
        auVar12[8] = (char)((uint)uVar4 >> 0x10);
        auVar12._0_8_ = uVar23;
        auVar12[9] = 0;
        auVar12._10_3_ = auVar11._10_3_;
        auVar26._5_8_ = 0;
        auVar26._0_5_ = auVar12._8_5_;
        auVar13[4] = (char)((uint)uVar4 >> 8);
        auVar13._0_4_ = (int)uVar23;
        auVar13[5] = 0;
        auVar13._6_7_ = SUB137(auVar26 << 0x40,6);
        iVar35 = iVar35 + (int)uVar23;
        iVar36 = iVar36 + auVar13._4_4_;
        iVar37 = iVar37 + auVar12._8_4_;
        iVar38 = iVar38 + (uint)(uint3)(auVar11._10_3_ >> 0x10);
        lVar31 = lVar31 + 4;
      } while (lVar31 != 8);
      uVar30 = (iVar38 + iVar36 + iVar37 + iVar35) * 2 + 8U >> 4;
    }
  }
  else {
    lVar31 = 0;
    iVar35 = 0;
    iVar36 = 0;
    iVar37 = 0;
    iVar38 = 0;
    do {
      uVar4 = *(undefined4 *)(top + lVar31);
      uVar23 = (ulong)(ushort)uVar4 & 0xffffffffffff00ff;
      auVar5._8_4_ = 0;
      auVar5._0_8_ = uVar23;
      auVar5[0xc] = (char)((uint)uVar4 >> 0x18);
      auVar6[8] = (char)((uint)uVar4 >> 0x10);
      auVar6._0_8_ = uVar23;
      auVar6[9] = 0;
      auVar6._10_3_ = auVar5._10_3_;
      auVar24._5_8_ = 0;
      auVar24._0_5_ = auVar6._8_5_;
      auVar7[4] = (char)((uint)uVar4 >> 8);
      auVar7._0_4_ = (int)uVar23;
      auVar7[5] = 0;
      auVar7._6_7_ = SUB137(auVar24 << 0x40,6);
      iVar35 = iVar35 + (int)uVar23;
      iVar36 = iVar36 + auVar7._4_4_;
      iVar37 = iVar37 + auVar6._8_4_;
      iVar38 = iVar38 + (uint)(uint3)(auVar5._10_3_ >> 0x10);
      lVar31 = lVar31 + 4;
    } while (lVar31 != 8);
    iVar35 = iVar38 + iVar36 + iVar37 + iVar35;
    if (left == (uint8_t *)0x0) {
      iVar35 = iVar35 * 2;
    }
    else {
      iVar36 = 0;
      iVar37 = 0;
      iVar38 = 0;
      lVar31 = 0;
      do {
        uVar4 = *(undefined4 *)(left + lVar31);
        uVar23 = (ulong)(ushort)uVar4 & 0xffffffffffff00ff;
        auVar8._8_4_ = 0;
        auVar8._0_8_ = uVar23;
        auVar8[0xc] = (char)((uint)uVar4 >> 0x18);
        auVar9[8] = (char)((uint)uVar4 >> 0x10);
        auVar9._0_8_ = uVar23;
        auVar9[9] = 0;
        auVar9._10_3_ = auVar8._10_3_;
        auVar25._5_8_ = 0;
        auVar25._0_5_ = auVar9._8_5_;
        auVar10[4] = (char)((uint)uVar4 >> 8);
        auVar10._0_4_ = (int)uVar23;
        auVar10[5] = 0;
        auVar10._6_7_ = SUB137(auVar25 << 0x40,6);
        iVar35 = iVar35 + (int)uVar23;
        iVar36 = iVar36 + auVar10._4_4_;
        iVar37 = iVar37 + auVar9._8_4_;
        iVar38 = iVar38 + (uint)(uint3)(auVar8._10_3_ >> 0x10);
        lVar31 = lVar31 + 4;
      } while (lVar31 != 8);
      iVar35 = iVar38 + iVar36 + iVar37 + iVar35;
    }
    uVar30 = iVar35 + 8 >> 4;
  }
  lVar31 = 0;
  do {
    *(ulong *)(dst + lVar31 + 0x400) = (ulong)(uVar30 & 0xff) * 0x101010101010101;
    lVar31 = lVar31 + 0x20;
  } while (lVar31 != 0x100);
  if (top == (uint8_t *)0x0) {
    lVar31 = 0;
    do {
      builtin_memcpy(dst + lVar31 + 0x500,"\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f",8);
      lVar31 = lVar31 + 0x20;
    } while (lVar31 != 0x100);
  }
  else {
    lVar31 = 0;
    do {
      *(undefined8 *)(dst + lVar31 + 0x500) = *(undefined8 *)top;
      lVar31 = lVar31 + 0x20;
    } while (lVar31 != 0x100);
  }
  plVar33 = (long *)(dst + 0x510);
  lVar31 = 0;
  if (left == (uint8_t *)0x0) {
    do {
      puVar34 = (uint8_t *)((long)plVar33 + lVar31);
      puVar34[0] = 0x81;
      puVar34[1] = 0x81;
      puVar34[2] = 0x81;
      puVar34[3] = 0x81;
      puVar34[4] = 0x81;
      puVar34[5] = 0x81;
      puVar34[6] = 0x81;
      puVar34[7] = 0x81;
      lVar31 = lVar31 + 0x20;
    } while (lVar31 != 0x100);
  }
  else {
    do {
      *plVar33 = (ulong)left[lVar31] * 0x101010101010101;
      lVar31 = lVar31 + 1;
      plVar33 = plVar33 + 4;
    } while (lVar31 != 8);
  }
  plVar33 = (long *)(dst + 0x410);
  if (left == (uint8_t *)0x0) {
    lVar31 = 0;
    if (top == (uint8_t *)0x0) {
      do {
        puVar34 = (uint8_t *)((long)plVar33 + lVar31);
        puVar34[0] = 0x81;
        puVar34[1] = 0x81;
        puVar34[2] = 0x81;
        puVar34[3] = 0x81;
        puVar34[4] = 0x81;
        puVar34[5] = 0x81;
        puVar34[6] = 0x81;
        puVar34[7] = 0x81;
        lVar31 = lVar31 + 0x20;
      } while (lVar31 != 0x100);
    }
    else {
      do {
        *(undefined8 *)((long)plVar33 + lVar31) = *(undefined8 *)top;
        lVar31 = lVar31 + 0x20;
      } while (lVar31 != 0x100);
    }
  }
  else if (top == (uint8_t *)0x0) {
    lVar31 = 0;
    do {
      *plVar33 = (ulong)left[lVar31] * 0x101010101010101;
      lVar31 = lVar31 + 1;
      plVar33 = plVar33 + 4;
    } while (lVar31 != 8);
  }
  else {
    bVar2 = left[-1];
    lVar31 = 0;
    do {
      bVar3 = left[lVar31];
      lVar32 = 0;
      do {
        *(uint8_t *)((long)plVar33 + lVar32) =
             clip1[(ulong)top[lVar32] + (ulong)bVar3 + (0xff - (ulong)bVar2)];
        lVar32 = lVar32 + 1;
      } while (lVar32 != 8);
      plVar33 = plVar33 + 4;
      lVar31 = lVar31 + 1;
    } while (lVar31 != 8);
  }
  puVar34 = left + 0x10;
  if (left == (uint8_t *)0x0) {
    puVar34 = (uint8_t *)0x0;
  }
  puVar1 = top + 8;
  if (top == (uint8_t *)0x0) {
    puVar1 = (uint8_t *)0x0;
    if (left == (uint8_t *)0x0) {
      uVar30 = 0x80;
    }
    else {
      lVar31 = 0;
      iVar35 = 0;
      iVar36 = 0;
      iVar37 = 0;
      iVar38 = 0;
      do {
        uVar4 = *(undefined4 *)(puVar34 + lVar31);
        uVar23 = (ulong)(ushort)uVar4 & 0xffffffffffff00ff;
        auVar20._8_4_ = 0;
        auVar20._0_8_ = uVar23;
        auVar20[0xc] = (char)((uint)uVar4 >> 0x18);
        auVar21[8] = (char)((uint)uVar4 >> 0x10);
        auVar21._0_8_ = uVar23;
        auVar21[9] = 0;
        auVar21._10_3_ = auVar20._10_3_;
        auVar29._5_8_ = 0;
        auVar29._0_5_ = auVar21._8_5_;
        auVar22[4] = (char)((uint)uVar4 >> 8);
        auVar22._0_4_ = (int)uVar23;
        auVar22[5] = 0;
        auVar22._6_7_ = SUB137(auVar29 << 0x40,6);
        iVar35 = iVar35 + (int)uVar23;
        iVar36 = iVar36 + auVar22._4_4_;
        iVar37 = iVar37 + auVar21._8_4_;
        iVar38 = iVar38 + (uint)(uint3)(auVar20._10_3_ >> 0x10);
        lVar31 = lVar31 + 4;
      } while (lVar31 != 8);
      uVar30 = (iVar38 + iVar36 + iVar37 + iVar35) * 2 + 8U >> 4;
    }
  }
  else {
    lVar31 = 0;
    iVar35 = 0;
    iVar36 = 0;
    iVar37 = 0;
    iVar38 = 0;
    do {
      uVar4 = *(undefined4 *)(puVar1 + lVar31);
      uVar23 = (ulong)(ushort)uVar4 & 0xffffffffffff00ff;
      auVar14._8_4_ = 0;
      auVar14._0_8_ = uVar23;
      auVar14[0xc] = (char)((uint)uVar4 >> 0x18);
      auVar15[8] = (char)((uint)uVar4 >> 0x10);
      auVar15._0_8_ = uVar23;
      auVar15[9] = 0;
      auVar15._10_3_ = auVar14._10_3_;
      auVar27._5_8_ = 0;
      auVar27._0_5_ = auVar15._8_5_;
      auVar16[4] = (char)((uint)uVar4 >> 8);
      auVar16._0_4_ = (int)uVar23;
      auVar16[5] = 0;
      auVar16._6_7_ = SUB137(auVar27 << 0x40,6);
      iVar35 = iVar35 + (int)uVar23;
      iVar36 = iVar36 + auVar16._4_4_;
      iVar37 = iVar37 + auVar15._8_4_;
      iVar38 = iVar38 + (uint)(uint3)(auVar14._10_3_ >> 0x10);
      lVar31 = lVar31 + 4;
    } while (lVar31 != 8);
    iVar35 = iVar38 + iVar36 + iVar37 + iVar35;
    if (left == (uint8_t *)0x0) {
      iVar35 = iVar35 * 2;
    }
    else {
      iVar36 = 0;
      iVar37 = 0;
      iVar38 = 0;
      lVar31 = 0;
      do {
        uVar4 = *(undefined4 *)(puVar34 + lVar31);
        uVar23 = (ulong)(ushort)uVar4 & 0xffffffffffff00ff;
        auVar17._8_4_ = 0;
        auVar17._0_8_ = uVar23;
        auVar17[0xc] = (char)((uint)uVar4 >> 0x18);
        auVar18[8] = (char)((uint)uVar4 >> 0x10);
        auVar18._0_8_ = uVar23;
        auVar18[9] = 0;
        auVar18._10_3_ = auVar17._10_3_;
        auVar28._5_8_ = 0;
        auVar28._0_5_ = auVar18._8_5_;
        auVar19[4] = (char)((uint)uVar4 >> 8);
        auVar19._0_4_ = (int)uVar23;
        auVar19[5] = 0;
        auVar19._6_7_ = SUB137(auVar28 << 0x40,6);
        iVar35 = iVar35 + (int)uVar23;
        iVar36 = iVar36 + auVar19._4_4_;
        iVar37 = iVar37 + auVar18._8_4_;
        iVar38 = iVar38 + (uint)(uint3)(auVar17._10_3_ >> 0x10);
        lVar31 = lVar31 + 4;
      } while (lVar31 != 8);
      iVar35 = iVar38 + iVar36 + iVar37 + iVar35;
    }
    uVar30 = iVar35 + 8 >> 4;
  }
  lVar31 = 0;
  do {
    *(ulong *)(dst + lVar31 + 0x408) = (ulong)(uVar30 & 0xff) * 0x101010101010101;
    lVar31 = lVar31 + 0x20;
  } while (lVar31 != 0x100);
  if (top == (uint8_t *)0x0) {
    lVar31 = 0;
    do {
      builtin_memcpy(dst + lVar31 + 0x508,"\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f",8);
      lVar31 = lVar31 + 0x20;
    } while (lVar31 != 0x100);
  }
  else {
    lVar31 = 0;
    do {
      *(undefined8 *)(dst + lVar31 + 0x508) = *(undefined8 *)puVar1;
      lVar31 = lVar31 + 0x20;
    } while (lVar31 != 0x100);
  }
  plVar33 = (long *)(dst + 0x518);
  lVar31 = 0;
  if (left == (uint8_t *)0x0) {
    do {
      *(undefined8 *)((long)plVar33 + lVar31) = 0x8181818181818181;
      lVar31 = lVar31 + 0x20;
    } while (lVar31 != 0x100);
  }
  else {
    do {
      *plVar33 = (ulong)puVar34[lVar31] * 0x101010101010101;
      lVar31 = lVar31 + 1;
      plVar33 = plVar33 + 4;
    } while (lVar31 != 8);
  }
  plVar33 = (long *)(dst + 0x418);
  if (left == (uint8_t *)0x0) {
    lVar31 = 0;
    if (top == (uint8_t *)0x0) {
      do {
        *(undefined8 *)((long)plVar33 + lVar31) = 0x8181818181818181;
        lVar31 = lVar31 + 0x20;
      } while (lVar31 != 0x100);
    }
    else {
      do {
        *(undefined8 *)((long)plVar33 + lVar31) = *(undefined8 *)puVar1;
        lVar31 = lVar31 + 0x20;
      } while (lVar31 != 0x100);
    }
  }
  else if (top == (uint8_t *)0x0) {
    lVar31 = 0;
    do {
      *plVar33 = (ulong)puVar34[lVar31] * 0x101010101010101;
      lVar31 = lVar31 + 1;
      plVar33 = plVar33 + 4;
    } while (lVar31 != 8);
  }
  else {
    bVar2 = puVar34[-1];
    lVar31 = 0;
    do {
      bVar3 = puVar34[lVar31];
      lVar32 = 0;
      do {
        *(uint8_t *)((long)plVar33 + lVar32) =
             clip1[(ulong)puVar1[lVar32] + (ulong)bVar3 + (0xff - (ulong)bVar2)];
        lVar32 = lVar32 + 1;
      } while (lVar32 != 8);
      plVar33 = plVar33 + 4;
      lVar31 = lVar31 + 1;
    } while (lVar31 != 8);
  }
  return;
}

Assistant:

static WEBP_INLINE void DCMode(uint8_t* dst, const uint8_t* left,
                               const uint8_t* top,
                               int size, int round, int shift) {
  int DC = 0;
  int j;
  if (top != NULL) {
    for (j = 0; j < size; ++j) DC += top[j];
    if (left != NULL) {   // top and left present
      for (j = 0; j < size; ++j) DC += left[j];
    } else {      // top, but no left
      DC += DC;
    }
    DC = (DC + round) >> shift;
  } else if (left != NULL) {   // left but no top
    for (j = 0; j < size; ++j) DC += left[j];
    DC += DC;
    DC = (DC + round) >> shift;
  } else {   // no top, no left, nothing.
    DC = 0x80;
  }
  Fill(dst, DC, size);
}